

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void process_replacement(c2m_ctx_t c2m_ctx,macro_call_t mc)

{
  short sVar1;
  ushort uVar2;
  macro_t pmVar3;
  token_t *pptVar4;
  token_t *pptVar5;
  VARR_token_t *pVVar6;
  pre_ctx *ppVar7;
  size_t sVar8;
  ulong uVar9;
  token_arr_t pVVar10;
  VARR_macro_call_t *pVVar11;
  VARR_char *pVVar12;
  VARR_char *pVVar13;
  pos_t pVar14;
  gen_ctx **ppgVar15;
  char cVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  long lVar21;
  c2m_ctx_t pcVar22;
  macro_t pmVar23;
  char *pcVar24;
  token_t ptVar25;
  token_t t;
  macro_call_t pmVar26;
  VARR_token_arr_t *pVVar27;
  token_arr_t *ppVVar28;
  gen_ctx *pgVar29;
  MIR_item_t pMVar30;
  c2m_ctx_t pcVar31;
  ulong uVar32;
  macro_call_t *ppmVar33;
  undefined1 *puVar34;
  ulong uVar35;
  char *pcVar36;
  char *pcVar37;
  node_t_conflict pnVar38;
  undefined4 *puVar39;
  long *plVar40;
  undefined8 *puVar41;
  void *pvVar42;
  uint uVar43;
  c2m_ctx_t pcVar44;
  uint uVar45;
  token_t t_00;
  char *format;
  long extraout_RDX;
  uint uVar46;
  MIR_context_t pMVar47;
  MIR_context_t pMVar48;
  c2m_ctx_t pcVar49;
  MIR_item_t pMVar50;
  c2m_ctx_t pcVar51;
  char *pcVar52;
  char **in_R8;
  token_t t_01;
  MIR_context_t pMVar53;
  size_t sVar54;
  c2m_ctx_t pcVar55;
  MIR_context_t pMVar56;
  size_t sVar57;
  bool bVar58;
  str_t sVar59;
  char *pcStack_170;
  size_t sStack_168;
  MIR_context_t pMStack_d8;
  uint local_64;
  
  pmVar3 = mc->macro;
  pcVar52 = (char *)pmVar3->replacement;
  pcVar31 = (c2m_ctx_t)mc;
  pcVar49 = c2m_ctx;
  if ((MIR_context_t)pcVar52 != (MIR_context_t)0x0) {
    iVar20 = *(int *)&((MIR_context_t)pcVar52)->gen_ctx;
    iVar17 = mc->repl_pos;
    if (iVar17 < iVar20) {
      pptVar4 = (token_t *)((MIR_context_t)pcVar52)->error_func;
      local_64 = 0xffffffff;
      do {
        pcVar52 = (char *)(ulong)(iVar17 + 1U);
        mc->repl_pos = iVar17 + 1U;
        pcVar22 = (c2m_ctx_t)pptVar4[iVar17];
        sVar1 = *(short *)&pcVar22->ctx;
        if (sVar1 == 0x103) {
          pcVar49 = (c2m_ctx_t)pmVar3->params;
          pcVar51 = (c2m_ctx_t)pcVar22->env[0].__jmpbuf[3];
          uVar18 = find_param((VARR_token_t *)pcVar49,(char *)pcVar51);
          if ((int)uVar18 < 0) {
            bVar58 = false;
            goto LAB_00193440;
          }
          pcVar52 = (char *)mc->args;
          if ((((MIR_context_t)pcVar52 == (MIR_context_t)0x0) ||
              ((token_t *)((MIR_context_t)pcVar52)->error_func == (token_t *)0x0)) ||
             (((MIR_context_t)pcVar52)->gen_ctx <= (gen_ctx *)(ulong)uVar18)) {
LAB_001935ae:
            process_replacement_cold_19();
LAB_001935b3:
            process_replacement_cold_9();
LAB_001935b8:
            process_replacement_cold_10();
LAB_001935bd:
            process_replacement_cold_3();
LAB_001935c2:
            process_replacement_cold_7();
LAB_001935c7:
            process_replacement_cold_12();
LAB_001935cc:
            process_replacement_cold_2();
LAB_001935d1:
            process_replacement_cold_8();
            pcVar31 = pcVar51;
            goto LAB_001935d6;
          }
          pcVar51 = *(c2m_ctx_t *)
                     ((long)((MIR_context_t)pcVar52)->error_func + (gen_ctx *)(ulong)uVar18 * 8);
          if (-1 < (int)local_64) {
            pcVar31 = (c2m_ctx_t)(ulong)local_64;
            del_tokens(mc->repl_buffer,local_64,-1);
            pcVar49 = pcVar51;
            if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001935f4;
            if (pcVar51->ctx != (MIR_context_t)0x0) {
              pptVar5 = (token_t *)pcVar51->env[0].__jmpbuf[0];
              if (pptVar5 == (token_t *)0x0) goto LAB_001935fe;
              sVar1 = *(short *)*pptVar5;
              if ((sVar1 == 0x20) || (sVar1 == 10)) {
                pcVar31 = (c2m_ctx_t)0x0;
                del_tokens((VARR_token_t *)pcVar51,0,1);
              }
            }
            pMVar47 = pcVar51->ctx;
            if (pMVar47 != (MIR_context_t)0x0) {
              pcVar52 = (char *)pcVar51->env[0].__jmpbuf[0];
              if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193603;
              uVar2 = **(ushort **)((long)pcVar52 + (long)pMVar47 * 8 + -8);
              pcVar52 = (char *)(ulong)uVar2;
              if ((uVar2 == 0x20) || (uVar2 == 10)) {
                pcVar51->ctx = (MIR_context_t)((long)&pMVar47[-1].wrapper_end_addr + 7);
              }
            }
            if (pcVar51->ctx == (MIR_context_t)0x0) {
              pmVar23 = mc->macro;
            }
            else {
              pmVar23 = (macro_t)pcVar51->env[0].__jmpbuf[0];
              if (pmVar23 == (macro_t)0x0) goto LAB_00193608;
            }
            ptVar25 = pmVar23->id;
            pcVar52 = (c2m_ctx->empty_str).s;
            sVar54 = (c2m_ctx->empty_str).len;
            pVar14 = ptVar25->pos;
            pnVar38 = new_node(c2m_ctx,N_STR);
            add_pos(c2m_ctx,pnVar38,pVar14);
            (pnVar38->u).s.s = pcVar52;
            (pnVar38->u).s.len = sVar54;
            pcVar52 = (ptVar25->pos).fname;
            lVar21 = *(long *)&(ptVar25->pos).lno;
            sVar59 = uniq_cstr(c2m_ctx,"");
            pcVar24 = sVar59.s;
            pcVar31 = (c2m_ctx_t)0x30;
            pcVar49 = c2m_ctx;
            pcVar22 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar22->ctx = 0x102;
            ((pos_t *)&pcVar22->options)->fname = pcVar52;
            pcVar22->env[0].__jmpbuf[0] = lVar21;
            pcVar22->env[0].__jmpbuf[3] = (long)pcVar24;
            *(undefined4 *)(pcVar22->env[0].__jmpbuf + 1) = 0;
            pcVar22->env[0].__jmpbuf[2] = (long)pnVar38;
            pcVar52 = (char *)c2m_ctx->temp_string;
            if (((MIR_context_t)pcVar52 != (MIR_context_t)0x0) &&
               ((token_t *)((MIR_context_t)pcVar52)->error_func != (token_t *)0x0)) {
              ((MIR_context_t)pcVar52)->gen_ctx = (gen_ctx *)0x0;
              cVar16 = *pcVar24;
              while (cVar16 != '\0') {
                pcVar24 = pcVar24 + 1;
                pVVar12 = c2m_ctx->temp_string;
                pcVar49 = (c2m_ctx_t)pVVar12->varr;
                if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935c2;
                uVar35 = pVVar12->els_num + 1;
                if (pVVar12->size < uVar35) {
                  sVar57 = (uVar35 >> 1) + uVar35;
                  pcVar52 = (char *)realloc(pcVar49,sVar57);
                  pVVar12->varr = pcVar52;
                  pVVar12->size = sVar57;
                }
                sVar54 = pVVar12->els_num;
                pcVar52 = pVVar12->varr;
                pVVar12->els_num = sVar54 + 1;
                *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = cVar16;
                cVar16 = *pcVar24;
              }
              pVVar12 = c2m_ctx->temp_string;
              pcVar49 = (c2m_ctx_t)pVVar12->varr;
              if (pcVar49 != (c2m_ctx_t)0x0) {
                uVar35 = pVVar12->els_num + 1;
                if (pVVar12->size < uVar35) {
                  sVar57 = (uVar35 >> 1) + uVar35;
                  pcVar52 = (char *)realloc(pcVar49,sVar57);
                  pVVar12->varr = pcVar52;
                  pVVar12->size = sVar57;
                }
                sVar54 = pVVar12->els_num;
                pcVar52 = pVVar12->varr;
                pVVar12->els_num = sVar54 + 1;
                *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x22;
                if (pcVar51->ctx != (MIR_context_t)0x0) {
                  pMVar47 = (MIR_context_t)0x0;
                  do {
                    pptVar5 = (token_t *)pcVar51->env[0].__jmpbuf[0];
                    if (pptVar5 == (token_t *)0x0) goto LAB_001935c7;
                    ptVar25 = pptVar5[(long)pMVar47];
                    uVar2 = *(ushort *)ptVar25;
                    pcVar52 = (char *)(ulong)uVar2;
                    if ((uVar2 == 0x20) || (uVar2 == 10)) {
                      pVVar12 = c2m_ctx->temp_string;
                      pcVar49 = (c2m_ctx_t)pVVar12->varr;
                      if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935d1;
                      uVar35 = pVVar12->els_num + 1;
                      if (pVVar12->size < uVar35) {
                        sVar57 = (uVar35 >> 1) + uVar35;
                        pcVar52 = (char *)realloc(pcVar49,sVar57);
                        pVVar12->varr = pcVar52;
                        pVVar12->size = sVar57;
                      }
                      sVar54 = pVVar12->els_num;
                      pcVar52 = pVVar12->varr;
                      pVVar12->els_num = sVar54 + 1;
                      *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x20;
                    }
                    else {
                      pcVar24 = ptVar25->repr;
                      cVar16 = *pcVar24;
                      if (cVar16 != '\0') {
                        pMVar48 = (MIR_context_t)((long)&pMVar47->gen_ctx + 1);
                        do {
                          pcVar52 = (char *)0x0;
                          if (pcVar51->ctx != pMVar48) {
                            if ((pcVar51->ctx <= pMVar48) ||
                               (pcVar52 = (char *)pcVar51->env[0].__jmpbuf[0],
                               (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) goto LAB_001935b3;
                            pcVar52 = (char *)(ulong)(uint)(int)**(char **)((&((pos_t *)
                                                                              &((MIR_context_t)
                                                                               pcVar52)->c2mir_ctx)
                                                                              ->fname)
                                                                            [(long)pMVar47] + 0x28);
                          }
                          if (cVar16 == '\"') {
LAB_00193278:
                            pVVar12 = c2m_ctx->temp_string;
                            pcVar49 = (c2m_ctx_t)pVVar12->varr;
                            if (pcVar49 == (c2m_ctx_t)0x0) goto LAB_001935b8;
                            uVar35 = pVVar12->els_num + 1;
                            if (pVVar12->size < uVar35) {
                              sVar57 = (uVar35 >> 1) + uVar35;
                              pcVar52 = (char *)realloc(pcVar49,sVar57);
                              pVVar12->varr = pcVar52;
                              pVVar12->size = sVar57;
                            }
                            sVar54 = pVVar12->els_num;
                            pcVar52 = pVVar12->varr;
                            pVVar12->els_num = sVar54 + 1;
                            *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) =
                                 0x5c;
                          }
                          else if (cVar16 == '\\') {
                            uVar18 = (uint)pcVar52;
                            if (((0x37 < uVar18 - 0x3f) ||
                                ((0xa880cc20000001U >> ((ulong)(uVar18 - 0x3f) & 0x3f) & 1) == 0))
                               && (bVar58 = (uVar18 & 0xfffffff8) == 0x30,
                                  uVar18 = uVar18 & 0xffffffdf,
                                  pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar18 >> 8),
                                                                    uVar18 == 0x58 || bVar58),
                                  uVar18 != 0x58 && !bVar58)) goto LAB_00193278;
                          }
                          pVVar12 = c2m_ctx->temp_string;
                          pcVar49 = (c2m_ctx_t)pVVar12->varr;
                          if (pcVar49 == (c2m_ctx_t)0x0) {
                            process_replacement_cold_11();
                            goto LAB_001935ae;
                          }
                          cVar16 = *pcVar24;
                          uVar35 = pVVar12->els_num + 1;
                          if (pVVar12->size < uVar35) {
                            sVar57 = (uVar35 >> 1) + uVar35;
                            pcVar52 = (char *)realloc(pcVar49,sVar57);
                            pVVar12->varr = pcVar52;
                            pVVar12->size = sVar57;
                          }
                          sVar54 = pVVar12->els_num;
                          pcVar52 = pVVar12->varr;
                          pVVar12->els_num = sVar54 + 1;
                          *(char *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = cVar16;
                          cVar16 = pcVar24[1];
                          pcVar24 = pcVar24 + 1;
                        } while (cVar16 != '\0');
                      }
                    }
                    pMVar47 = (MIR_context_t)((long)&pMVar47->gen_ctx + 1);
                  } while (pMVar47 < pcVar51->ctx);
                }
                pVVar12 = c2m_ctx->temp_string;
                pcVar49 = (c2m_ctx_t)pVVar12->varr;
                if (pcVar49 != (c2m_ctx_t)0x0) {
                  uVar35 = pVVar12->els_num + 1;
                  if (pVVar12->size < uVar35) {
                    pcVar31 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
                    pcVar51 = pcVar31;
                    pcVar52 = (char *)realloc(pcVar49,(size_t)pcVar31);
                    pVVar12->varr = pcVar52;
                    pVVar12->size = (size_t)pcVar31;
                  }
                  sVar54 = pVVar12->els_num;
                  pcVar52 = pVVar12->varr;
                  pVVar12->els_num = sVar54 + 1;
                  *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0x22;
                  pVVar12 = c2m_ctx->temp_string;
                  pcVar49 = (c2m_ctx_t)pVVar12->varr;
                  if (pcVar49 != (c2m_ctx_t)0x0) {
                    uVar35 = pVVar12->els_num + 1;
                    if (pVVar12->size < uVar35) {
                      pcVar31 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
                      pcVar51 = pcVar31;
                      pcVar52 = (char *)realloc(pcVar49,(size_t)pcVar31);
                      pVVar12->varr = pcVar52;
                      pVVar12->size = (size_t)pcVar31;
                    }
                    sVar54 = pVVar12->els_num;
                    pcVar52 = pVVar12->varr;
                    pVVar12->els_num = sVar54 + 1;
                    *(undefined1 *)((long)&((MIR_context_t)pcVar52)->gen_ctx + sVar54) = 0;
                    if (c2m_ctx->temp_string != (VARR_char *)0x0) {
                      sVar59 = uniq_cstr(c2m_ctx,c2m_ctx->temp_string->varr);
                      pcVar22->env[0].__jmpbuf[3] = (long)sVar59.s;
                      set_string_val(c2m_ctx,(token_t)pcVar22,c2m_ctx->temp_string,0x20);
                      bVar58 = true;
                      goto LAB_00193440;
                    }
                    goto LAB_001935ef;
                  }
                  goto LAB_001935f9;
                }
                goto LAB_001935ea;
              }
              goto LAB_001935e5;
            }
            goto LAB_001935db;
          }
          iVar17 = mc->repl_pos;
          lVar21 = (long)iVar17;
          if (((((lVar21 < 2) ||
                (pcVar52 = (char *)pptVar4[lVar21 + -2],
                *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) &&
               ((iVar17 < 3 ||
                ((*(short *)pptVar4[lVar21 + -2] != 0x20 ||
                 (pcVar52 = (char *)pptVar4[lVar21 + -3],
                 *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))))) &&
              ((iVar20 <= iVar17 ||
               (pcVar52 = (char *)pptVar4[lVar21],
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)))) &&
             (((iVar20 <= iVar17 + 1 ||
               (pcVar52 = (char *)pptVar4[iVar17 + 1],
               *(short *)&((MIR_context_t)pcVar52)->gen_ctx != 0x142)) ||
              (*(short *)pptVar4[lVar21] != 0x20)))) {
            pcVar52 = ((pos_t *)&pcVar22->options)->fname;
            pptVar4 = (token_t *)pcVar22->env[0].__jmpbuf[0];
            ptVar25 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar25 = 0x144;
            (ptVar25->pos).fname = pcVar52;
            *(token_t **)&(ptVar25->pos).lno = pptVar4;
            ptVar25->repr = "";
            ptVar25->node_code = N_IGNORE;
            ptVar25->node = (node_t_conflict)0x0;
            unget_next_pptoken(c2m_ctx,ptVar25);
            copy_and_push_back(c2m_ctx,(VARR_token_t *)pcVar51,mc->pos);
            pcVar52 = ((pos_t *)&pcVar22->options)->fname;
            pptVar4 = (token_t *)pcVar22->env[0].__jmpbuf[0];
            ptVar25 = (token_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)ptVar25 = 0x143;
            (ptVar25->pos).fname = pcVar52;
            *(token_t **)&(ptVar25->pos).lno = pptVar4;
            ptVar25->repr = "";
            ptVar25->node_code = N_IGNORE;
            ptVar25->node = (node_t_conflict)0x0;
            unget_next_pptoken(c2m_ctx,ptVar25);
            return;
          }
          if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001935bd;
          if (pcVar51->ctx == (MIR_context_t)0x1) {
            pptVar5 = (token_t *)pcVar51->env[0].__jmpbuf[0];
            if (pptVar5 == (token_t *)0x0) goto LAB_001935cc;
            sVar1 = *(short *)*pptVar5;
            if ((sVar1 == 0x20) || (sVar1 == 10)) goto LAB_00192ee5;
          }
          else if (pcVar51->ctx == (MIR_context_t)0x0) {
LAB_00192ee5:
            pcVar52 = ((pos_t *)&pcVar22->options)->fname;
            pptVar5 = (token_t *)pcVar22->env[0].__jmpbuf[0];
            pcVar22 = (c2m_ctx_t)reg_malloc(c2m_ctx,0x30);
            *(undefined4 *)&pcVar22->ctx = 0x141;
            ((pos_t *)&pcVar22->options)->fname = pcVar52;
            pcVar22->env[0].__jmpbuf[0] = (long)pptVar5;
            pcVar22->env[0].__jmpbuf[3] = (long)"";
            *(undefined4 *)(pcVar22->env[0].__jmpbuf + 1) = 0;
            pcVar22->env[0].__jmpbuf[2] = 0;
            bVar58 = true;
            goto LAB_00193440;
          }
          pcVar49 = (c2m_ctx_t)mc->repl_buffer;
          add_tokens((VARR_token_t *)pcVar49,(VARR_token_t *)pcVar51);
        }
        else {
          if (sVar1 != 0x20) {
            if (sVar1 == 0x23) {
              pcVar51 = pcVar22;
              if (mc->repl_buffer == (VARR_token_t *)0x0) goto LAB_001935e0;
              local_64 = (uint)mc->repl_buffer->els_num;
            }
            else {
              local_64 = 0xffffffff;
            }
          }
          bVar58 = false;
LAB_00193440:
          if (!bVar58) {
            pcVar22 = (c2m_ctx_t)copy_token(c2m_ctx,(token_t)pcVar22,mc->pos);
          }
          pcVar49 = (c2m_ctx_t)mc->repl_buffer;
          add_token((VARR_token_t *)pcVar49,(token_t)pcVar22);
        }
        iVar17 = mc->repl_pos;
      } while (iVar17 < iVar20);
    }
    ptVar25 = get_next_pptoken_1(c2m_ctx,0);
    unget_next_pptoken(c2m_ctx,ptVar25);
    pcVar52 = (ptVar25->pos).fname;
    iVar20 = (ptVar25->pos).lno;
    iVar17 = (ptVar25->pos).ln_pos;
    ptVar25 = (token_t)reg_malloc(c2m_ctx,0x30);
    *(undefined4 *)ptVar25 = 0x145;
    (ptVar25->pos).fname = pcVar52;
    (ptVar25->pos).lno = iVar20;
    (ptVar25->pos).ln_pos = iVar17;
    ptVar25->repr = "";
    ptVar25->node_code = N_IGNORE;
    ptVar25->node = (node_t_conflict)0x0;
    unget_next_pptoken(c2m_ctx,ptVar25);
    pVVar6 = mc->repl_buffer;
    do_concat(c2m_ctx,pVVar6);
    push_back(c2m_ctx,pVVar6);
    pmVar3->ignore_p = 1;
    return;
  }
LAB_001935d6:
  process_replacement_cold_20();
LAB_001935db:
  process_replacement_cold_17();
  pcVar51 = pcVar31;
LAB_001935e0:
  process_replacement_cold_1();
LAB_001935e5:
  process_replacement_cold_16();
LAB_001935ea:
  process_replacement_cold_15();
LAB_001935ef:
  process_replacement_cold_13();
  pcVar31 = pcVar51;
LAB_001935f4:
  pcVar51 = pcVar31;
  process_replacement_cold_18();
LAB_001935f9:
  process_replacement_cold_14();
  pcVar31 = pcVar51;
  pcVar51 = pcVar49;
LAB_001935fe:
  process_replacement_cold_4();
LAB_00193603:
  process_replacement_cold_5();
LAB_00193608:
  process_replacement_cold_6();
  ppVar7 = pcVar51->pre_ctx;
  while( true ) {
    ptVar25 = get_next_pptoken_1(pcVar51,0);
    sVar1 = *(short *)ptVar25;
    if (sVar1 != 0x145) break;
    pop_macro_call(pcVar51);
  }
  if ((sVar1 == 10) || (sVar1 == 0x20)) {
    t = get_next_pptoken_1(pcVar51,0);
    t_01 = ptVar25;
  }
  else {
    t_01 = (token_t)0x0;
    t = ptVar25;
  }
  if (*(short *)t != 0x28) {
    unget_next_pptoken(pcVar51,t);
    if (t_01 != (token_t)0x0) {
      unget_next_pptoken(pcVar51,t_01);
    }
    out_token(pcVar51,t_00);
    return;
  }
  pcVar49 = (c2m_ctx_t)(t_00->pos).fname;
  pmVar26 = new_macro_call((macro_t)pcVar31,t_00->pos);
  pmVar3 = pmVar26->macro;
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pVVar27 = (VARR_token_arr_t *)malloc(0x18);
  if (pVVar27 == (VARR_token_arr_t *)0x0) {
LAB_00193c1e:
    mir_varr_error((char *)pMVar50);
  }
  pVVar27->els_num = 0;
  pVVar27->size = 0x10;
  ppVVar28 = (token_arr_t *)malloc(0x80);
  pVVar27->varr = ppVVar28;
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pgVar29 = (gen_ctx *)malloc(0x18);
  if (pgVar29 == (gen_ctx *)0x0) goto LAB_00193c1e;
  pgVar29->ctx = (MIR_context_t)0x0;
  ((pos_t *)&pgVar29->optimize_level)->fname = (char *)0x10;
  pMVar50 = (MIR_item_t)0x80;
  pMVar30 = (MIR_item_t)malloc(0x80);
  pgVar29->curr_func_item = pMVar30;
  pVVar6 = pmVar3->params;
  if (pVVar6 == (VARR_token_t *)0x0) {
LAB_00193c37:
    try_param_macro_call_cold_17();
LAB_00193c3c:
    try_param_macro_call_cold_15();
    goto LAB_00193c41;
  }
  uVar35 = pVVar6->els_num;
  uVar46 = 0;
  uVar18 = 0;
  if (uVar35 != 1) {
LAB_00193740:
    bVar58 = false;
    do {
      pcVar49 = (c2m_ctx_t)0x0;
      pcVar31 = (c2m_ctx_t)get_next_pptoken_1(pcVar51,0);
      if (*(short *)&pcVar31->ctx == 0x145) {
        pcVar49 = (c2m_ctx_t)0x0;
        pcVar31 = (c2m_ctx_t)get_next_pptoken_1(pcVar51,0);
        pop_macro_call(pcVar51);
      }
      uVar19 = *(uint *)&pcVar31->ctx & 0xffff;
      uVar43 = *(uint *)&pcVar31->ctx * 0x10000;
      pcVar52 = (char *)(ulong)uVar43;
      uVar45 = uVar43 + 0xfec30000 >> 0x10;
      if ((((uVar45 < 0xb) && (pcVar49 = (c2m_ctx_t)0x5c1, (0x5c1U >> (uVar45 & 0x1f) & 1) != 0)) ||
          (pcVar52 = (char *)(ulong)CONCAT31((int3)(uVar43 >> 8),uVar43 == 0x230000),
          (bool)(bVar58 & uVar43 == 0x230000))) ||
         (uVar43 = uVar19 ^ 0x29 | uVar46, pcVar52 = (char *)(ulong)uVar43, uVar43 == 0)) {
        if (uVar19 != 0x29) {
          in_R8 = (char **)pmVar3->id->repr;
          pcVar52 = "unfinished call of macro %s";
          error(pcVar51,0x1c3620,(char *)pcVar31->options,pcVar31->env[0].__jmpbuf[0]);
          pcVar49 = pcVar31;
          unget_next_pptoken(pcVar51,(token_t)pcVar31);
        }
        pMVar50 = (MIR_item_t)pVVar27->varr;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c3c;
        uVar32 = pVVar27->els_num + 1;
        if (pVVar27->size < uVar32) {
          sVar54 = (uVar32 >> 1) + uVar32;
          pcVar49 = (c2m_ctx_t)(sVar54 * 8);
          ppVVar28 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
          pVVar27->varr = ppVVar28;
          pVVar27->size = sVar54;
        }
        uVar9 = pVVar27->els_num;
        uVar32 = uVar9 + 1;
        pVVar27->els_num = uVar32;
        pVVar27->varr[uVar9] = (token_arr_t)pgVar29;
        pcVar52 = (char *)(uVar9 | uVar35);
        if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) {
          pcVar52 = (char *)pVVar27->varr;
          if ((MIR_context_t)pcVar52 == (MIR_context_t)0x0) goto LAB_00193c55;
          pgVar29 = ((MIR_context_t)pcVar52)->gen_ctx;
          if (pgVar29 == (gen_ctx *)0x0) goto LAB_00193c5a;
          pcVar49 = (c2m_ctx_t)pgVar29->ctx;
          if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_00193b7d:
            pVVar27->els_num = uVar9;
            pgVar29 = (&((MIR_context_t)pcVar52)->gen_ctx)[uVar9];
            if ((pgVar29 == (gen_ctx *)0x0) ||
               (pMVar50 = pgVar29->curr_func_item, pMVar50 == (MIR_item_t)0x0)) goto LAB_00193c5f;
            free(pMVar50);
            free(pgVar29);
            goto LAB_00193ba7;
          }
          if (pcVar49 == (c2m_ctx_t)&DAT_00000001) {
            if (pgVar29->curr_func_item == (MIR_item_t)0x0) goto LAB_00193c69;
            if (*pgVar29->curr_func_item->data == 0x20) goto LAB_00193b7d;
          }
        }
        if (uVar32 <= uVar35) {
          if (uVar35 <= uVar32) goto LAB_00193ba7;
          pMStack_d8 = (MIR_context_t)0x1c365f;
          goto LAB_00193a8a;
        }
        if (pVVar27->varr == (token_arr_t *)0x0) goto LAB_00193c4b;
        pVVar10 = pVVar27->varr[uVar35];
        if (pVVar10 == (token_arr_t)0x0) goto LAB_00193c50;
        if (pVVar10->els_num != 0) {
          if (pVVar10->varr == (token_t *)0x0) goto LAB_00193c64;
          pcVar31 = (c2m_ctx_t)*pVVar10->varr;
        }
        pMStack_d8 = (MIR_context_t)0x1c363c;
        goto LAB_00193a2f;
      }
      pcVar52 = (char *)(ulong)(uVar46 | uVar18);
      if (uVar19 == 0x2c && (uVar46 | uVar18) == 0) {
        pMVar50 = (MIR_item_t)pVVar27->varr;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c32;
        uVar32 = pVVar27->els_num + 1;
        if (pVVar27->size < uVar32) {
          sVar54 = (uVar32 >> 1) + uVar32;
          pcVar49 = (c2m_ctx_t)(sVar54 * 8);
          ppVVar28 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
          pVVar27->varr = ppVVar28;
          pVVar27->size = sVar54;
        }
        sVar8 = pVVar27->els_num;
        pcVar52 = (char *)pVVar27->varr;
        sVar54 = sVar8 + 1;
        pVVar27->els_num = sVar54;
        (&((MIR_context_t)pcVar52)->gen_ctx)[sVar8] = pgVar29;
        pMVar50 = (MIR_item_t)&DAT_00000018;
        pgVar29 = (gen_ctx *)malloc(0x18);
        if (pgVar29 == (gen_ctx *)0x0) goto LAB_00193c1e;
        pgVar29->ctx = (MIR_context_t)0x0;
        ((pos_t *)&pgVar29->optimize_level)->fname = (char *)0x10;
        pMVar50 = (MIR_item_t)0x80;
        pMVar30 = (MIR_item_t)malloc(0x80);
        pgVar29->curr_func_item = pMVar30;
        uVar46 = 0;
        if (sVar54 == uVar35 - 1) {
          pVVar6 = pmVar3->params;
          if (((pVVar6 == (VARR_token_t *)0x0) ||
              (pcVar52 = (char *)pVVar6->varr, (MIR_context_t)pcVar52 == (MIR_context_t)0x0)) ||
             (pVVar6->els_num <= uVar35 - 1)) goto LAB_00193c28;
          iVar20 = strcmp(*(char **)(*(long *)((long)pcVar52 + uVar35 * 8 + -8) + 0x28),"...");
          uVar18 = (uint)(iVar20 == 0);
        }
        else {
          uVar18 = 0;
        }
      }
      else {
        pMVar50 = pgVar29->curr_func_item;
        if (pMVar50 == (MIR_item_t)0x0) goto LAB_00193c2d;
        pcVar52 = (char *)((long)&pgVar29->ctx->gen_ctx + 1);
        if (((pos_t *)&pgVar29->optimize_level)->fname < pcVar52) {
          pMVar50 = (MIR_item_t)realloc(pMVar50,(long)(pcVar52 + ((ulong)pcVar52 >> 1)) * 8);
          pgVar29->curr_func_item = pMVar50;
          ((pos_t *)&pgVar29->optimize_level)->fname = pcVar52 + ((ulong)pcVar52 >> 1);
        }
        pMVar47 = pgVar29->ctx;
        pgVar29->ctx = (MIR_context_t)((long)&pMVar47->gen_ctx + 1);
        (&pgVar29->curr_func_item->data)[(long)pMVar47] = pcVar31;
        if (*(short *)&pcVar31->ctx == 0x28) {
          uVar46 = uVar46 + 1;
        }
        else if (*(short *)&pcVar31->ctx == 0x29) {
          uVar46 = uVar46 - 1;
        }
      }
      bVar58 = *(short *)&pcVar31->ctx == 10;
    } while( true );
  }
  if (pVVar6->varr != (token_t *)0x0) {
    uVar18 = (uint)(*(short *)*pVVar6->varr == 0x10f);
    goto LAB_00193740;
  }
  goto LAB_00193c46;
LAB_00193a8a:
  pMVar50 = (MIR_item_t)&DAT_00000018;
  pgVar29 = (gen_ctx *)malloc(0x18);
  if (pgVar29 != (gen_ctx *)0x0) {
    pgVar29->ctx = (MIR_context_t)0x0;
    ((pos_t *)&pgVar29->optimize_level)->fname = (char *)0x10;
    pMVar50 = (MIR_item_t)malloc(0x80);
    pgVar29->curr_func_item = pMVar50;
    pMVar50 = (MIR_item_t)pVVar27->varr;
    if (pMVar50 != (MIR_item_t)0x0) goto code_r0x00193aca;
    try_param_macro_call_cold_6();
LAB_00193c28:
    try_param_macro_call_cold_2();
LAB_00193c2d:
    try_param_macro_call_cold_1();
LAB_00193c32:
    try_param_macro_call_cold_3();
    goto LAB_00193c37;
  }
  goto LAB_00193c1e;
code_r0x00193aca:
  uVar32 = uVar32 + 1;
  if (pVVar27->size < uVar32) {
    sVar54 = (uVar32 >> 1) + uVar32;
    pcVar49 = (c2m_ctx_t)(sVar54 * 8);
    ppVVar28 = (token_arr_t *)realloc(pMVar50,(size_t)pcVar49);
    pVVar27->varr = ppVVar28;
    pVVar27->size = sVar54;
  }
  sVar54 = pVVar27->els_num;
  pcVar52 = (char *)pVVar27->varr;
  uVar32 = sVar54 + 1;
  pVVar27->els_num = uVar32;
  (&((MIR_context_t)pcVar52)->gen_ctx)[sVar54] = pgVar29;
  if (uVar35 <= uVar32) goto LAB_00193b11;
  goto LAB_00193a8a;
  while( true ) {
    ppgVar15 = &pMVar53->gen_ctx;
    pMVar53 = (MIR_context_t)((long)&pMVar53->gen_ctx + 1);
    if (pptVar4[(long)((long)ppgVar15 + 1)]->node_code == N_GT) break;
LAB_00193d8d:
    pcVar22 = (c2m_ctx_t)((long)pcVar51->env[0].__jmpbuf + (long)&pMVar53[-1].setjmp_addr);
    if (pcVar22 == (c2m_ctx_t)&DAT_00000001) goto LAB_0019413a;
  }
  pcVar22 = (c2m_ctx_t)
            CONCAT71((int7)((ulong)pptVar4[(long)((long)ppgVar15 + 1)] >> 8),pMVar53 < pMVar47);
LAB_00193db0:
  if ((char)pcVar22 == '\0') goto LAB_0019413a;
  pVVar12 = pcVar31->symbol_text;
  if ((pVVar12 == (VARR_char *)0x0) ||
     (pcVar51 = (c2m_ctx_t)pVVar12->varr, pcVar51 == (c2m_ctx_t)0x0)) goto LAB_001941ef;
  pVVar12->els_num = 0;
  pVVar13 = pcVar31->temp_string;
  if ((pVVar13 == (VARR_char *)0x0) || (pVVar13->varr == (char *)0x0)) goto LAB_001941f4;
  pVVar13->els_num = 0;
  uVar35 = pVVar12->els_num + 1;
  if (pVVar12->size < uVar35) {
    pcVar55 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
    pcVar22 = pcVar55;
    pcVar36 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar12->varr = pcVar36;
    pVVar12->size = (size_t)pcVar55;
  }
  sVar54 = pVVar12->els_num;
  pVVar12->els_num = sVar54 + 1;
  pVVar12->varr[sVar54] = '<';
  if (pMVar56 < pMVar53) {
    do {
      lVar21 = pcVar49->env[0].__jmpbuf[0];
      if ((lVar21 == 0) || (pcVar49->ctx <= pMVar56)) goto LAB_001941ea;
      pcVar36 = *(char **)(*(long *)(lVar21 + (long)pMVar56 * 8) + 0x28);
      cVar16 = *pcVar36;
      while (cVar16 != '\0') {
        pVVar12 = pcVar31->symbol_text;
        pcVar51 = (c2m_ctx_t)pVVar12->varr;
        if (pcVar51 == (c2m_ctx_t)0x0) {
LAB_001941d1:
          get_header_name_cold_2();
          goto LAB_001941d6;
        }
        uVar35 = pVVar12->els_num + 1;
        if (pVVar12->size < uVar35) {
          pcVar55 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
          pcVar22 = pcVar55;
          pcVar37 = (char *)realloc(pcVar51,(size_t)pcVar55);
          pVVar12->varr = pcVar37;
          pVVar12->size = (size_t)pcVar55;
        }
        sVar54 = pVVar12->els_num;
        pVVar12->els_num = sVar54 + 1;
        pVVar12->varr[sVar54] = cVar16;
        pVVar12 = pcVar31->temp_string;
        pcVar51 = (c2m_ctx_t)pVVar12->varr;
        if (pcVar51 == (c2m_ctx_t)0x0) {
          get_header_name_cold_1();
          goto LAB_001941d1;
        }
        cVar16 = *pcVar36;
        uVar35 = pVVar12->els_num + 1;
        if (pVVar12->size < uVar35) {
          pcVar55 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
          pcVar22 = pcVar55;
          pcVar37 = (char *)realloc(pcVar51,(size_t)pcVar55);
          pVVar12->varr = pcVar37;
          pVVar12->size = (size_t)pcVar55;
        }
        sVar54 = pVVar12->els_num;
        pVVar12->els_num = sVar54 + 1;
        pVVar12->varr[sVar54] = cVar16;
        cVar16 = pcVar36[1];
        pcVar36 = pcVar36 + 1;
      }
      pMVar56 = (MIR_context_t)((long)&pMVar56->gen_ctx + 1);
    } while (pMVar56 != pMVar53);
  }
  pVVar12 = pcVar31->symbol_text;
  pcVar51 = (c2m_ctx_t)pVVar12->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_001941fe;
  uVar35 = pVVar12->els_num + 1;
  if (pVVar12->size < uVar35) {
    pcVar55 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
    pcVar22 = pcVar55;
    pcVar36 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar12->varr = pcVar36;
    pVVar12->size = (size_t)pcVar55;
  }
  sVar54 = pVVar12->els_num;
  pVVar12->els_num = sVar54 + 1;
  pVVar12->varr[sVar54] = '>';
  pVVar12 = pcVar31->symbol_text;
  pcVar51 = (c2m_ctx_t)pVVar12->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_00194203;
  uVar35 = pVVar12->els_num + 1;
  if (pVVar12->size < uVar35) {
    pcVar55 = (c2m_ctx_t)((uVar35 >> 1) + uVar35);
    pcVar22 = pcVar55;
    pcVar36 = (char *)realloc(pcVar51,(size_t)pcVar55);
    pVVar12->varr = pcVar36;
    pVVar12->size = (size_t)pcVar55;
  }
  sVar54 = pVVar12->els_num;
  pVVar12->els_num = sVar54 + 1;
  pVVar12->varr[sVar54] = '\0';
  pVVar12 = pcVar31->temp_string;
  pcVar51 = (c2m_ctx_t)pVVar12->varr;
  if (pcVar51 == (c2m_ctx_t)0x0) goto LAB_00194208;
  uVar35 = pVVar12->els_num + 1;
  if (pVVar12->size < uVar35) {
    sVar57 = (uVar35 >> 1) + uVar35;
    pcVar36 = (char *)realloc(pcVar51,sVar57);
    pVVar12->varr = pcVar36;
    pVVar12->size = sVar57;
  }
  sVar54 = pVVar12->els_num;
  pVVar12->els_num = sVar54 + 1;
  pVVar12->varr[sVar54] = '\0';
  pcVar22 = (c2m_ctx_t)((ulong)pMVar48 & 0xffffffff);
  pcVar51 = pcVar49;
  del_tokens((VARR_token_t *)pcVar49,(int)pMVar48,(int)pMVar53 - (int)pMVar48);
  if (pcVar31->symbol_text != (VARR_char *)0x0) {
    if (pcVar31->temp_string == (VARR_char *)0x0) goto LAB_00194212;
    pcVar36 = pcVar31->symbol_text->varr;
    sVar59 = uniq_cstr(pcVar31,pcVar31->temp_string->varr);
    pnVar38 = new_node(pcVar31,N_STR);
    add_pos(pcVar31,pnVar38,pVar14);
    pcStack_170 = sVar59.s;
    (pnVar38->u).l = (mir_long)pcStack_170;
    sStack_168 = sVar59.len;
    (pnVar38->u).s.len = sStack_168;
    sVar59 = uniq_cstr(pcVar31,pcVar36);
    pcVar22 = (c2m_ctx_t)0x30;
    pcVar51 = pcVar31;
    puVar39 = (undefined4 *)reg_malloc(pcVar31,0x30);
    *puVar39 = 0x13e;
    *(char **)(puVar39 + 2) = pcVar24;
    *(token_t **)(puVar39 + 4) = pptVar5;
    *(char **)(puVar39 + 10) = sVar59.s;
    puVar39[6] = 0;
    *(node_t_conflict *)(puVar39 + 8) = pnVar38;
    lVar21 = pcVar49->env[0].__jmpbuf[0];
    if ((lVar21 != 0) && (pMVar48 < pcVar49->ctx)) {
      *(undefined4 **)(lVar21 + (long)pMVar48 * 8) = puVar39;
      goto LAB_0019413a;
    }
    goto LAB_001941f9;
  }
  goto LAB_0019420d;
  while( true ) {
    pVVar27->els_num = uVar32 - 1;
    pMVar30 = (MIR_item_t)pVVar27->varr[uVar32 - 1];
    if ((pMVar30 == (MIR_item_t)0x0) ||
       (pMVar50 = (pMVar30->item_link).prev, pMVar50 == (MIR_item_t)0x0)) {
      try_param_macro_call_cold_9();
      goto LAB_00193c19;
    }
    free(pMVar50);
    free(pMVar30);
    uVar32 = pVVar27->els_num;
    pMVar50 = pMVar30;
    if (uVar32 <= uVar35) break;
LAB_00193a2f:
    if (pVVar27->varr == (token_arr_t *)0x0) {
LAB_00193c19:
      try_param_macro_call_cold_10();
      goto LAB_00193c1e;
    }
  }
LAB_00193b11:
  in_R8 = (char **)pmVar3->id->repr;
  pcVar49 = (c2m_ctx_t)((pos_t *)&pcVar31->options)->fname;
  error(pcVar51,pMStack_d8,(char *)pcVar49,pcVar31->env[0].__jmpbuf[0]);
  pcVar52 = (char *)pMStack_d8;
LAB_00193ba7:
  pmVar26->args = pVVar27;
  pVVar11 = ppVar7->macro_call_stack;
  pMVar50 = (MIR_item_t)pVVar11->varr;
  if (pMVar50 != (MIR_item_t)0x0) {
    uVar35 = pVVar11->els_num + 1;
    if (pVVar11->size < uVar35) {
      sVar54 = (uVar35 >> 1) + uVar35;
      ppmVar33 = (macro_call_t *)realloc(pMVar50,sVar54 * 8);
      pVVar11->varr = ppmVar33;
      pVVar11->size = sVar54;
    }
    sVar54 = pVVar11->els_num;
    pVVar11->els_num = sVar54 + 1;
    pVVar11->varr[sVar54] = pmVar26;
    return;
  }
LAB_00193c41:
  try_param_macro_call_cold_8();
LAB_00193c46:
  try_param_macro_call_cold_16();
LAB_00193c4b:
  try_param_macro_call_cold_12();
LAB_00193c50:
  try_param_macro_call_cold_11();
LAB_00193c55:
  try_param_macro_call_cold_14();
LAB_00193c5a:
  try_param_macro_call_cold_13();
LAB_00193c5f:
  try_param_macro_call_cold_5();
LAB_00193c64:
  try_param_macro_call_cold_7();
LAB_00193c69:
  try_param_macro_call_cold_4();
  pMVar50 = pMVar50[5].item_link.prev;
  pcVar31 = (c2m_ctx_t)(pMVar50->item_link).prev;
  if (pcVar31 != (c2m_ctx_t)0x0) {
    puVar34 = &((token_t)pMVar50->data)->field_0x1;
    if (pMVar50->module < puVar34) {
      pMVar30 = (MIR_item_t)realloc(pcVar31,(long)(puVar34 + ((ulong)puVar34 >> 1)) * 8);
      (pMVar50->item_link).prev = pMVar30;
      pMVar50->module = (MIR_module_t)(puVar34 + ((ulong)puVar34 >> 1));
    }
    ptVar25 = (token_t)pMVar50->data;
    pMVar50->data = &ptVar25->field_0x1;
    (&((pMVar50->item_link).prev)->data)[(long)ptVar25] = pcVar49;
    return;
  }
  unget_next_pptoken_cold_1();
  if (((pcVar31 != (c2m_ctx_t)0x0) && (pcVar31->env[0].__jmpbuf[0] != 0)) &&
     (pcVar52 = (char *)pcVar31->ctx, (MIR_context_t)pcVar52 != (MIR_context_t)0x0)) {
    return;
  }
  VARR_token_arr_tlast_cold_1();
  *in_R8 = (char *)0x0;
  pcVar22 = pcVar49;
  pcVar51 = pcVar31;
  if (pcVar49 == (c2m_ctx_t)0x0) {
LAB_001941d6:
    get_header_name_cold_15();
LAB_001941db:
    get_header_name_cold_12();
LAB_001941e0:
    get_header_name_cold_13();
  }
  else {
    pMVar47 = pcVar49->ctx;
    if (pMVar47 != (MIR_context_t)0x0) {
      pptVar4 = (token_t *)pcVar49->env[0].__jmpbuf[0];
      if (pptVar4 == (token_t *)0x0) goto LAB_001941db;
      pMVar48 = (MIR_context_t)0x0;
      do {
        pcVar51 = (c2m_ctx_t)pptVar4[(long)pMVar48];
        if (*(short *)&pcVar51->ctx != 0x20) {
          if ((pMVar48 < pMVar47) && (*(int *)(pcVar51->env[0].__jmpbuf + 1) == 0x17)) {
            pMVar56 = (MIR_context_t)((long)&pMVar48->gen_ctx + 1);
            pcVar22 = (c2m_ctx_t)CONCAT71((int7)((ulong)pcVar49 >> 8),pMVar56 < pMVar47);
            if (pMVar56 < pMVar47) {
              pcVar24 = ((pos_t *)&pcVar51->options)->fname;
              pptVar5 = (token_t *)pcVar51->env[0].__jmpbuf[0];
              pVar14 = *(pos_t *)&pcVar51->options;
              pcVar51 = (c2m_ctx_t)pptVar4[(long)((long)&pMVar48->gen_ctx + 1)];
              pMVar53 = pMVar56;
              if (*(int *)(pcVar51->env[0].__jmpbuf + 1) == 0x19) goto LAB_00193db0;
              pcVar51 = (c2m_ctx_t)(2 - (long)pMVar47);
              goto LAB_00193d8d;
            }
          }
          break;
        }
        pMVar48 = (MIR_context_t)((long)&pMVar48->gen_ctx + 1);
      } while (pMVar47 != pMVar48);
    }
LAB_0019413a:
    pcVar55 = (c2m_ctx_t)pcVar49->ctx;
    if (pcVar55 == (c2m_ctx_t)0x0) {
      pcVar44 = (c2m_ctx_t)0x0;
    }
    else {
      puVar41 = (undefined8 *)pcVar49->env[0].__jmpbuf[0];
      if (puVar41 == (undefined8 *)0x0) goto LAB_001941e0;
      pcVar44 = (c2m_ctx_t)(ulong)(*(short *)*puVar41 == 0x20);
    }
    pcVar22 = (c2m_ctx_t)((long)&pcVar55[-1].gen_ctx + 7);
    if (pcVar44 != pcVar22) {
LAB_001941a4:
      error(pcVar31,0x1c3085,format,pcVar52);
      return;
    }
    if ((pcVar44 < pcVar55) && (lVar21 = pcVar49->env[0].__jmpbuf[0], lVar21 != 0)) {
      ptVar25 = *(token_t *)(lVar21 + (long)pcVar44 * 8);
      sVar1 = *(short *)ptVar25;
      if ((sVar1 == 0x102) || (sVar1 == 0x13e)) {
        get_include_fname(pcVar31,ptVar25,in_R8);
        return;
      }
      goto LAB_001941a4;
    }
  }
  get_header_name_cold_14();
LAB_001941ea:
  get_header_name_cold_9();
LAB_001941ef:
  get_header_name_cold_11();
LAB_001941f4:
  get_header_name_cold_10();
LAB_001941f9:
  get_header_name_cold_3();
LAB_001941fe:
  get_header_name_cold_8();
LAB_00194203:
  get_header_name_cold_7();
LAB_00194208:
  get_header_name_cold_6();
LAB_0019420d:
  get_header_name_cold_5();
LAB_00194212:
  get_header_name_cold_4();
  plVar40 = (long *)malloc(0x30);
  *plVar40 = (long)pcVar51;
  plVar40[1] = (long)pcVar22;
  plVar40[2] = extraout_RDX;
  *(undefined4 *)(plVar40 + 4) = 0;
  plVar40[3] = 0;
  pcVar52 = &DAT_00000018;
  puVar41 = (undefined8 *)malloc(0x18);
  plVar40[5] = (long)puVar41;
  if (puVar41 == (undefined8 *)0x0) {
    mir_varr_error(pcVar52);
  }
  *puVar41 = 0;
  puVar41[1] = 0x40;
  pvVar42 = malloc(0x200);
  puVar41[2] = pvVar42;
  return;
}

Assistant:

static void process_replacement (c2m_ctx_t c2m_ctx, macro_call_t mc) {
  macro_t m;
  token_t t, *m_repl;
  VARR (token_t) * arg;
  int i, m_repl_len, sharp_pos, copy_p;

  m = mc->macro;
  sharp_pos = -1;
  m_repl = VARR_ADDR (token_t, m->replacement);
  m_repl_len = (int) VARR_LENGTH (token_t, m->replacement);
  for (;;) {
    if (mc->repl_pos >= m_repl_len) {
      t = get_next_pptoken (c2m_ctx);
      unget_next_pptoken (c2m_ctx, t);
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <%s>\n", get_token_str (t));
#endif
      unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOR, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
      fprintf (stderr, "# push back <EOR>: mc=%lx\n", mc);
#endif
      push_back (c2m_ctx, do_concat (c2m_ctx, mc->repl_buffer));
      m->ignore_p = TRUE;
      return;
    }
    t = m_repl[mc->repl_pos++];
    copy_p = TRUE;
    if (t->code == T_ID) {
      i = find_param (m->params, t->repr);
      if (i >= 0) {
        arg = VARR_GET (token_arr_t, mc->args, i);
        if (sharp_pos >= 0) {
          del_tokens (mc->repl_buffer, sharp_pos, -1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_GET (token_t, arg, 0)->code == ' '
                  || VARR_GET (token_t, arg, 0)->code == '\n'))
            del_tokens (arg, 0, 1);
          if (VARR_LENGTH (token_t, arg) != 0
              && (VARR_LAST (token_t, arg)->code == ' ' || VARR_LAST (token_t, arg)->code == '\n'))
            VARR_POP (token_t, arg);
          t = token_stringify (c2m_ctx, mc->macro->id, arg);
          copy_p = FALSE;
        } else if ((mc->repl_pos >= 2 && m_repl[mc->repl_pos - 2]->code == T_RDBLNO)
                   || (mc->repl_pos >= 3 && m_repl[mc->repl_pos - 2]->code == ' '
                       && m_repl[mc->repl_pos - 3]->code == T_RDBLNO)
                   || (mc->repl_pos < m_repl_len && m_repl[mc->repl_pos]->code == T_RDBLNO)
                   || (mc->repl_pos + 1 < m_repl_len && m_repl[mc->repl_pos + 1]->code == T_RDBLNO
                       && m_repl[mc->repl_pos]->code == ' ')) {
          if (VARR_LENGTH (token_t, arg) == 0
              || (VARR_LENGTH (token_t, arg) == 1
                  && (VARR_GET (token_t, arg, 0)->code == ' '
                      || VARR_GET (token_t, arg, 0)->code == '\n'))) {
            t = new_token (c2m_ctx, t->pos, "", T_PLM, N_IGNORE);
            copy_p = FALSE;
          } else {
            add_tokens (mc->repl_buffer, arg);
            continue;
          }
        } else {
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_EOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <EOA> for macro %s call\n", mc->macro->id->repr);
#endif
          copy_and_push_back (c2m_ctx, arg, mc->pos);
          unget_next_pptoken (c2m_ctx, new_token (c2m_ctx, t->pos, "", T_BOA, N_IGNORE));
#ifdef C2MIR_PREPRO_DEBUG
          fprintf (stderr, "# push back <BOA> for macro %s call\n", mc->macro->id->repr);
#endif
          return;
        }
      }
    } else if (t->code == '#') {
      sharp_pos = (int) VARR_LENGTH (token_t, mc->repl_buffer);
    } else if (t->code != ' ') {
      sharp_pos = -1;
    }
    if (copy_p) t = copy_token (c2m_ctx, t, mc->pos);
    add_token (mc->repl_buffer, t);
  }
}